

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::validateICC(LodePNGICC *icc)

{
  LodePNGICC *icc_local;
  uint local_4;
  
  if (icc->inputspace == 0) {
    local_4 = 0;
  }
  else if ((icc->inputspace == 2) && (icc->has_chromaticity == 0)) {
    local_4 = 0;
  }
  else if (icc->has_whitepoint == 0) {
    local_4 = 0;
  }
  else if (icc->has_trc == 0) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static unsigned validateICC(const LodePNGICC* icc) {
  /* disable for unsupported things in the icc profile */
  if(icc->inputspace == 0) return 0;
  /* if we didn't recognize both chrm and trc, then maybe the ICC uses data
  types not supported here yet, so fall back to not using it. */
  if(icc->inputspace == 2) {
    /* RGB profile should have chromaticities */
    if(!icc->has_chromaticity) return 0;
  }
  /* An ICC profile without whitepoint is invalid for the kind of profiles used here. */
  if(!icc->has_whitepoint) return 0;
  if(!icc->has_trc) return 0;
  return 1; /* ok */
}